

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

bool __thiscall
fmt::v9::detail::anon_func::count_code_points::operator()
          (count_code_points *this,uint32_t cp,string_view param_2)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  lVar1 = 1;
  if ((0x10ff < cp) && (lVar1 = 2, 1 < cp - 0x2329 && 0x115f < cp)) {
    auVar2._0_4_ = -(uint)(-0x7fffd45d < (int)(cp - 0xac00 ^ 0x80000000));
    auVar2._4_4_ = -(uint)(-0x7ffffe01 < (int)(cp - 0xf900 ^ 0x80000000));
    auVar2._8_4_ = -(uint)(-0x7ffffff7 < (int)(cp - 0xfe10 ^ 0x80000000));
    auVar2._12_4_ = -(uint)(-0x7fffffc1 < (int)(cp - 0xfe30 ^ 0x80000000));
    auVar3._0_4_ = -(uint)(-0x7fffffa0 < (int)(cp - 0xff00 ^ 0x80000000));
    auVar3._4_4_ = -(uint)(-0x7ffffffa < (int)(cp - 0xffe0 ^ 0x80000000));
    auVar3._8_4_ = -(uint)(-0x7fff0003 < (int)((cp & 0xfffefffe) - 0x20000 ^ 0x80000000));
    auVar3._12_4_ = -(uint)(-0x7ffffcb1 < (int)(cp - 0x1f300 ^ 0x80000000));
    auVar2 = packssdw(auVar2,auVar3);
    auVar2 = packsswb(auVar2,auVar2);
    if (((byte)(SUB161(auVar2 >> 7,0) & 1 | (SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar2 >> 0x17,0) & 1) << 2 | (SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar2 >> 0x27,0) & 1) << 4 | (SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar2 >> 0x37,0) & 1) << 6 | SUB161(auVar2 >> 0x3f,0) << 7) == 0xff) &&
       (cp == 0x303f || 0x764f < cp - 0x2e80)) {
      lVar1 = (ulong)((cp & 0xffffff00) == 0x1f900) + 1;
    }
  }
  *this->count = *this->count + lVar1;
  return true;
}

Assistant:

FMT_CONSTEXPR auto operator()(uint32_t cp, string_view) const -> bool {
      *count += detail::to_unsigned(
          1 +
          (cp >= 0x1100 &&
           (cp <= 0x115f ||  // Hangul Jamo init. consonants
            cp == 0x2329 ||  // LEFT-POINTING ANGLE BRACKET
            cp == 0x232a ||  // RIGHT-POINTING ANGLE BRACKET
            // CJK ... Yi except IDEOGRAPHIC HALF FILL SPACE:
            (cp >= 0x2e80 && cp <= 0xa4cf && cp != 0x303f) ||
            (cp >= 0xac00 && cp <= 0xd7a3) ||    // Hangul Syllables
            (cp >= 0xf900 && cp <= 0xfaff) ||    // CJK Compatibility Ideographs
            (cp >= 0xfe10 && cp <= 0xfe19) ||    // Vertical Forms
            (cp >= 0xfe30 && cp <= 0xfe6f) ||    // CJK Compatibility Forms
            (cp >= 0xff00 && cp <= 0xff60) ||    // Fullwidth Forms
            (cp >= 0xffe0 && cp <= 0xffe6) ||    // Fullwidth Forms
            (cp >= 0x20000 && cp <= 0x2fffd) ||  // CJK
            (cp >= 0x30000 && cp <= 0x3fffd) ||
            // Miscellaneous Symbols and Pictographs + Emoticons:
            (cp >= 0x1f300 && cp <= 0x1f64f) ||
            // Supplemental Symbols and Pictographs:
            (cp >= 0x1f900 && cp <= 0x1f9ff))));
      return true;
    }